

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

char * lookup_gname_helper(name_cache_conflict *cache,id_t id)

{
  long lVar1;
  archive *a;
  int iVar2;
  void *pvVar3;
  uint *puVar4;
  __gid_t in_ESI;
  undefined8 *in_RDI;
  int r;
  size_t nbuff_size;
  char *nbuff;
  group *result;
  group grent;
  group *local_40;
  group local_38;
  __gid_t local_14;
  undefined8 *local_10;
  char *local_8;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_RDI[2] == 0) {
    in_RDI[2] = 0x100;
    pvVar3 = malloc(in_RDI[2]);
    local_10[1] = pvVar3;
  }
  if (local_10[1] == 0) {
    local_8 = (char *)0x0;
  }
  else {
    while( true ) {
      local_40 = &local_38;
      iVar2 = getgrgid_r(local_14,&local_38,(char *)local_10[1],local_10[2],&local_40);
      if ((iVar2 == 0) || (iVar2 != 0x22)) break;
      lVar1 = local_10[2];
      pvVar3 = realloc((void *)local_10[1],lVar1 << 1);
      if (pvVar3 == (void *)0x0) break;
      local_10[1] = pvVar3;
      local_10[2] = lVar1 << 1;
    }
    if (iVar2 == 0) {
      if (local_40 == (group *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        local_8 = strdup(local_40->gr_name);
      }
    }
    else {
      a = (archive *)*local_10;
      puVar4 = (uint *)__errno_location();
      archive_set_error(a,(int)(ulong)*puVar4,"Can\'t lookup group for id %d",(ulong)local_14);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

static int
lookup_gname_helper(struct cpio *cpio, const char **name, id_t id)
{
	struct group	*grent;

	(void)cpio; /* UNUSED */

	errno = 0;
	grent = getgrgid((gid_t)id);
	if (grent == NULL) {
		*name = NULL;
		if (errno != 0)
			lafe_warnc(errno, "getgrgid(%s) failed",
			    cpio_i64toa((int64_t)id));
		return (errno);
	}

	*name = grent->gr_name;
	return (0);
}